

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-lore.c
# Opt level: O0

void lore_description(textblock *tb,monster_race *race,monster_lore *original_lore,_Bool spoilers)

{
  _Bool _Var1;
  bitflag local_b4 [8];
  bitflag known_flags [12];
  monster_lore *lore;
  monster_lore mutable_lore;
  _Bool spoilers_local;
  monster_lore *original_lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  known_flags._4_8_ = &lore;
  mutable_lore._119_1_ = spoilers;
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (original_lore != (monster_lore *)0x0)) {
    memcpy((void *)known_flags._4_8_,original_lore,0x78);
    if (((mutable_lore._119_1_ & 1) != 0) ||
       (_Var1 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST"), _Var1)) {
      cheat_monster_lore(race,(monster_lore_conflict *)known_flags._4_8_);
    }
    monster_flags_known(race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    if ((mutable_lore._119_1_ & 1) == 0) {
      lore_title(tb,race);
      textblock_append(tb,"\n");
    }
    if ((mutable_lore._119_1_ & 1) == 0) {
      lore_append_kills(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    }
    lore_append_flavor(tb,race);
    lore_append_movement(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    if ((mutable_lore._119_1_ & 1) == 0) {
      lore_append_toughness(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    }
    if ((mutable_lore._119_1_ & 1) == 0) {
      lore_append_exp(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    }
    lore_append_drop(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    lore_append_abilities(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    lore_append_awareness(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    lore_append_friends(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    lore_append_spells(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    lore_append_attack(tb,race,(monster_lore_conflict *)known_flags._4_8_,local_b4);
    _Var1 = lore_is_fully_known(race);
    if (_Var1) {
      textblock_append(tb,"You know everything about this monster.");
    }
    _Var1 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
    if ((_Var1) && (cave->ghost->string_type == L'\x02')) {
      textblock_append(tb,"%s  ",cave->ghost->string);
    }
    _Var1 = quest_unique_monster_check(race);
    if (_Var1) {
      textblock_append(tb,"You feel an intense desire to kill this monster...  ");
    }
    textblock_append(tb,"\n");
    return;
  }
  __assert_fail("tb && race && original_lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-mon-lore.c"
                ,0x65,
                "void lore_description(textblock *, const struct monster_race *, const struct monster_lore *, _Bool)"
               );
}

Assistant:

void lore_description(textblock *tb, const struct monster_race *race,
					  const struct monster_lore *original_lore, bool spoilers)
{
	struct monster_lore mutable_lore;
	struct monster_lore *lore = &mutable_lore;
	bitflag known_flags[RF_SIZE];

	assert(tb && race && original_lore);

	/* Hack -- create a copy of the monster-memory that we can modify */
	memcpy(lore, original_lore, sizeof(struct monster_lore));

	/* Spoilers or player ghost -- know everything */
	if (spoilers || rf_has(race->flags, RF_PLAYER_GHOST))
		cheat_monster_lore(race, lore);

	/* Now get the known monster flags */
	monster_flags_known(race, lore, known_flags);

	/* Appending the title here simplifies code in the callers. It also causes
	 * a crash when generating spoilers (we don't need titles for them anwyay)*/
	if (!spoilers) {
		lore_title(tb, race);
		textblock_append(tb, "\n");
	}

	/* Show kills of monster vs. player(s) */
	if (!spoilers)
		lore_append_kills(tb, race, lore, known_flags);

	lore_append_flavor(tb, race);

	/* Describe the monster type, speed, life, and armor */
	lore_append_movement(tb, race, lore, known_flags);

	if (!spoilers)
		lore_append_toughness(tb, race, lore, known_flags);

	/* Describe the experience and item reward when killed */
	if (!spoilers)
		lore_append_exp(tb, race, lore, known_flags);

	lore_append_drop(tb, race, lore, known_flags);

	/* Describe the special properties of the monster */
	lore_append_abilities(tb, race, lore, known_flags);
	lore_append_awareness(tb, race, lore, known_flags);
	lore_append_friends(tb, race, lore, known_flags);

	/* Describe the spells, spell-like abilities and melee attacks */
	lore_append_spells(tb, race, lore, known_flags);
	lore_append_attack(tb, race, lore, known_flags);

	/* Do we know everything */
	if (lore_is_fully_known(race))
		textblock_append(tb, "You know everything about this monster.");

	/* Player ghosts may have unique descriptions. */
	if (rf_has(race->flags, RF_PLAYER_GHOST) && (cave->ghost->string_type == 2))
		textblock_append(tb, "%s  ", cave->ghost->string);

	/* Notice "Quest" monsters */
	if (quest_unique_monster_check(race))
		textblock_append(tb, "You feel an intense desire to kill this monster...  ");

	textblock_append(tb, "\n");
}